

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseEncoding(State *state)

{
  bool bVar1;
  void *in_RDI;
  State copy;
  undefined1 local_40 [40];
  State *in_stack_ffffffffffffffe8;
  bool local_1;
  
  memcpy(local_40,in_RDI,0x30);
  bVar1 = ParseName(in_stack_ffffffffffffffe8);
  if ((bVar1) && (bVar1 = ParseBareFunctionType(in_stack_ffffffffffffffe8), bVar1)) {
    local_1 = true;
  }
  else {
    memcpy(in_RDI,local_40,0x30);
    bVar1 = ParseName(in_stack_ffffffffffffffe8);
    if ((bVar1) || (bVar1 = ParseSpecialName(in_stack_ffffffffffffffe8), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool ParseEncoding(State *state) {
  State copy = *state;
  if (ParseName(state) && ParseBareFunctionType(state)) {
    return true;
  }
  *state = copy;

  if (ParseName(state) || ParseSpecialName(state)) {
    return true;
  }
  return false;
}